

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O1

void __thiscall
PatternAddressMapper::export_pattern_internal
          (PatternAddressMapper *this,vector<Aggressor,_std::allocator<Aggressor>_> *aggressors,
          int base_period,vector<volatile_char_*,_std::allocator<volatile_char_*>_> *addresses,
          vector<int,_std::allocator<int>_> *rows)

{
  int iVar1;
  iterator __position;
  size_type sVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  ulong uVar5;
  stringstream local_228 [8];
  stringstream pattern_str;
  undefined1 local_218 [376];
  ulong local_a0;
  vector<char_volatile*,std::allocator<char_volatile*>> *local_98;
  vector<Aggressor,_std::allocator<Aggressor>_> *local_90;
  string local_88;
  ulong local_68;
  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_60;
  string local_58;
  int local_34 [2];
  value_type agg;
  
  local_98 = (vector<char_volatile*,std::allocator<char_volatile*>> *)addresses;
  std::__cxx11::stringstream::stringstream(local_228);
  if ((aggressors->super__Vector_base<Aggressor,_std::allocator<Aggressor>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (aggressors->super__Vector_base<Aggressor,_std::allocator<Aggressor>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_a0 = (ulong)base_period;
    local_60 = &(this->aggressor_to_addr)._M_h;
    uVar5 = 0;
    local_68 = 0;
    local_90 = aggressors;
    do {
      if ((uVar5 != 0) && (uVar5 % local_a0 == 0)) {
        std::ios::widen((char)*(_func_int **)(local_218._0_8_ + -0x18) + (char)local_218);
        std::ostream::put((char)local_218);
        std::ostream::flush();
      }
      local_34[0] = (aggressors->super__Vector_base<Aggressor,_std::allocator<Aggressor>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar5].id;
      if (local_34[0] == -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\x1b[0;31m",7);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"-1",2);
        local_68 = CONCAT71((int7)((ulong)poVar4 >> 8),1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\x1b[0m",4);
      }
      else {
        sVar2 = std::
                _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count(local_60,local_34);
        if (sVar2 == 0) {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,
                     "Could not find a valid address mapping for aggressor with ID %d.","");
          format_string<int>(&local_58,&local_88,local_34[0]);
          Logger::log_error(&local_58,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          aggressors = local_90;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            aggressors = local_90;
          }
        }
        else {
          pmVar3 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)local_60,local_34);
          local_58._M_dataplus._M_p = (pointer)DRAMAddr::to_virt(pmVar3);
          std::vector<char_volatile*,std::allocator<char_volatile*>>::emplace_back<char_volatile*>
                    (local_98,(char **)&local_58);
          pmVar3 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)local_60,local_34);
          iVar1 = (int)pmVar3->row;
          local_58._M_dataplus._M_p._0_4_ = iVar1;
          __position._M_current =
               (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
          if (__position._M_current ==
              (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (rows,__position,(int *)&local_58);
          }
          else {
            *__position._M_current = iVar1;
            (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
          std::__detail::
          _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)local_60,local_34);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_218);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(aggressors->
                                   super__Vector_base<Aggressor,_std::allocator<Aggressor>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(aggressors->
                                   super__Vector_base<Aggressor,_std::allocator<Aggressor>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
    if ((local_68 & 1) != 0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,
                 "Found at least an invalid aggressor in the pattern. These aggressors were NOT added but printed to visualize their position."
                 ,"");
      Logger::log_error(&local_58,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      Logger::log_data(&local_58,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__cxx11::stringstream::~stringstream(local_228);
  std::ios_base::~ios_base((ios_base *)(local_218 + 0x70));
  return;
}

Assistant:

void PatternAddressMapper::export_pattern_internal(
    std::vector<Aggressor> &aggressors, int base_period,
    std::vector<volatile char *> &addresses,
    std::vector<int> &rows) {

  bool invalid_aggs = false;
  std::stringstream pattern_str;
  for (size_t i = 0; i < aggressors.size(); ++i) {
    // for better visualization: add linebreak after each base period
    if (i!=0 && (i%base_period)==0) {
      pattern_str << std::endl;
    }

    // check whether this is a valid aggressor, i.e., the aggressor's ID != -1
    auto agg = aggressors[i];
    if (agg.id==ID_PLACEHOLDER_AGG) {
      pattern_str << FC_RED << "-1" << F_RESET;
      invalid_aggs = true;
      continue;
    }

    // check whether there exists a aggressor ID -> address mapping before trying to access it
    if (aggressor_to_addr.count(agg.id)==0) {
      Logger::log_error(format_string("Could not find a valid address mapping for aggressor with ID %d.", agg.id));
      continue;
    }

    // retrieve virtual address of current aggressor in pattern and add it to output vector
    addresses.push_back((volatile char *) aggressor_to_addr.at(agg.id).to_virt());
    rows.push_back(static_cast<int>(aggressor_to_addr.at(agg.id).row));
    pattern_str << aggressor_to_addr.at(agg.id).row << " ";
  }

  // print string representation of pattern
//  Logger::log_info("Pattern filled by random DRAM rows:");
//  Logger::log_data(pattern_str.str());

  if (invalid_aggs) {
    Logger::log_error(
        "Found at least an invalid aggressor in the pattern. "
        "These aggressors were NOT added but printed to visualize their position.");
    Logger::log_data(pattern_str.str());
  }
}